

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
aeron::util::SourcedException::SourcedException
          (SourcedException *this,string *what,string *function,string *file,int line)

{
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int line_local;
  string *file_local;
  string *function_local;
  string *what_local;
  SourcedException *this_local;
  
  local_2c = line;
  psStack_28 = file;
  file_local = function;
  function_local = what;
  what_local = (string *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__SourcedException_00226828;
  std::operator+(&local_90,file_local," : ");
  std::operator+(&local_70,&local_90,psStack_28);
  std::operator+(&local_50,&local_70," : ");
  std::__cxx11::to_string(&local_c0,local_2c);
  std::operator+(&this->m_where,&local_50,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&this->m_what,(string *)function_local);
  return;
}

Assistant:

SourcedException(const std::string &what, const std::string& function, const std::string& file, const int line) :
        m_where(function + " : " + file + " : " + std::to_string(line)),
        m_what(what)
    {
    }